

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void rd_4dim_slice(char **content,size_t *line_no,int *array,int *dim,int *shift,int *post)

{
  int delta_post;
  int delta_pre;
  int i;
  int *post_local;
  int *shift_local;
  int *dim_local;
  int *array_local;
  size_t *line_no_local;
  char **content_local;
  
  if (*shift + shift[1] + shift[2] + shift[3] + *post + post[1] + post[2] + post[3] == 0) {
    rd_1dim(content,line_no,array,*dim * dim[1] * dim[2] * dim[3],0);
  }
  else {
    for (delta_post = *shift; delta_post < *dim - *post; delta_post = delta_post + 1) {
      rd_3dim_slice(content,line_no,array + delta_post * dim[1] * dim[2] * dim[3],dim + 1,shift + 1,
                    post + 1);
    }
  }
  return;
}

Assistant:

PRIVATE void
rd_4dim_slice(char    **content,
              size_t  *line_no,
              int     *array,
              int     dim[4],
              int     shift[4],
              int     post[4])
{
  int i;
  int delta_pre   = shift[0] + shift[1] + shift[2] + shift[3];
  int delta_post  = post[0] + post[1] + post[2] + post[3];

  if (delta_pre + delta_post == 0) {
    rd_1dim(content, line_no, array, dim[0] * dim[1] * dim[2] * dim[3], 0);
    return;
  }

  for (i = shift[0]; i < dim[0] - post[0]; i++) {
    rd_3dim_slice(content, line_no, array + (i * dim[1] * dim[2] * dim[3]),
                  dim + 1,
                  shift + 1,
                  post + 1);
  }
  return;
}